

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.cc
# Opt level: O2

int __thiscall lock::seedOf(lock *this)

{
  if (0 < this->aRealKeyLength) {
    return (uint)(byte)this->aRealKey[0] |
           (uint)(byte)this->aRealKey[1] << 8 |
           (uint)(byte)this->aRealKey[2] << 0x10 | (uint)(byte)this->aRealKey[3] << 0x18;
  }
  return 0;
}

Assistant:

int lock::seedOf() {
  int seed = 0;
  if (aRealKeyLength > 0) {
    seed = ((aRealKey[3] << 24) + ((aRealKey[2] << 16) & 0xff0000) +
           ((aRealKey[1] << 8) & 0xff00) + (aRealKey[0] & 0xff));
  }
  return seed;
}